

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

void __thiscall
duckdb::WindowQuantileState<duckdb::interval_t>::UpdateSkip
          (WindowQuantileState<duckdb::interval_t> *this,CursorType *data,SubFrames *frames,
          IncludedType *included)

{
  unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>,_true>
  *this_00;
  ulong uVar1;
  pointer pFVar2;
  unsigned_long *puVar3;
  CURSOR_TYPE *pCVar4;
  reference pvVar5;
  const_reference pvVar6;
  _Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_false>
  _Var7;
  _Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_false>
  _Var8;
  type this_01;
  reference pvVar9;
  ColumnDataScanState *pCVar10;
  ColumnDataScanState *pCVar11;
  SubFrames *this_02;
  FrameBounds *frame;
  pointer pFVar12;
  SkipListUpdater updater;
  SkipListUpdater local_48;
  
  this_00 = &this->s;
  if ((this->s).
      super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
      .
      super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_false>
      ._M_head_impl !=
      (HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
       *)0x0) {
    this_02 = &this->prevs;
    pvVar5 = vector<duckdb::FrameBounds,_true>::back(this_02);
    uVar1 = pvVar5->end;
    pvVar6 = vector<duckdb::FrameBounds,_true>::front(frames);
    if (pvVar6->start < uVar1) {
      pvVar6 = vector<duckdb::FrameBounds,_true>::back(frames);
      uVar1 = pvVar6->end;
      pvVar5 = vector<duckdb::FrameBounds,_true>::front(this_02);
      if (pvVar5->start < uVar1) {
        if ((this_00->
            super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
            .
            super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_false>
            ._M_head_impl ==
            (HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
             *)0x0) {
          _Var7._M_head_impl =
               (HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                *)operator_new(0x50);
          (_Var7._M_head_impl)->_vptr_HeadNode = (_func_int **)&PTR__HeadNode_00891328;
          ((_Var7._M_head_impl)->_pool).cache =
               (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                *)0x0;
          (_Var7._M_head_impl)->_count = 0;
          *(undefined8 *)&((_Var7._M_head_impl)->_nodeRefs)._nodes = 0;
          ((_Var7._M_head_impl)->_nodeRefs)._nodes.
          super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ((_Var7._M_head_impl)->_nodeRefs)._nodes.
          super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((_Var7._M_head_impl)->_nodeRefs)._swapLevel = 0;
          ((_Var7._M_head_impl)->_pool).prng.state_ = 0xcafef00dd15ea5e7;
          (this_00->
          super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
          .
          super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_false>
          ._M_head_impl = _Var7._M_head_impl;
        }
        local_48.skip =
             unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>,_true>
             ::operator*(this_00);
        local_48.data = data;
        local_48.included = included;
        AggregateExecutor::
        IntersectFrames<duckdb::WindowQuantileState<duckdb::interval_t>::SkipListUpdater>
                  (this_02,frames,&local_48);
        return;
      }
    }
    _Var7._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
         .
         super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_false>
         ._M_head_impl;
    (this_00->
    super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
    .
    super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_false>
    ._M_head_impl =
         (HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
          *)0x0;
    if (_Var7._M_head_impl !=
        (HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
         *)0x0) {
      (**(code **)((long)(_Var7._M_head_impl)->_vptr_HeadNode + 8))();
      _Var7._M_head_impl =
           (this_00->
           super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
           .
           super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_false>
           ._M_head_impl;
      goto LAB_004f2a56;
    }
  }
  _Var7._M_head_impl =
       (HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
        *)0x0;
LAB_004f2a56:
  _Var8._M_head_impl =
       (HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
        *)operator_new(0x50);
  (_Var8._M_head_impl)->_vptr_HeadNode = (_func_int **)&PTR__HeadNode_00891328;
  ((_Var8._M_head_impl)->_pool).cache =
       (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
        *)0x0;
  (_Var8._M_head_impl)->_count = 0;
  *(undefined8 *)&((_Var8._M_head_impl)->_nodeRefs)._nodes = 0;
  ((_Var8._M_head_impl)->_nodeRefs)._nodes.
  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((_Var8._M_head_impl)->_nodeRefs)._nodes.
  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((_Var8._M_head_impl)->_nodeRefs)._swapLevel = 0;
  ((_Var8._M_head_impl)->_pool).prng.state_ = 0xcafef00dd15ea5e7;
  (this_00->
  super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
  .
  super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_false>
  ._M_head_impl = _Var8._M_head_impl;
  if (_Var7._M_head_impl !=
      (HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
       *)0x0) {
    (*(_Var7._M_head_impl)->_vptr_HeadNode[1])(_Var7._M_head_impl);
  }
  this_01 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>,_true>
            ::operator*(this_00);
  pFVar12 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
            super__Vector_impl_data._M_start;
  pFVar2 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
           super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pFVar12 != pFVar2) {
    do {
      for (pCVar11 = (ColumnDataScanState *)pFVar12->start;
          pCVar11 < (ColumnDataScanState *)pFVar12->end;
          pCVar11 = (ColumnDataScanState *)
                    ((long)&(pCVar11->current_chunk_state).handles._M_h._M_buckets + 1)) {
        puVar3 = (included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar3 == (unsigned_long *)0x0) ||
           ((puVar3[(ulong)pCVar11 >> 6] >> ((ulong)pCVar11 & 0x3f) & 1) != 0)) {
          pCVar4 = included->dmask;
          pCVar10 = (ColumnDataScanState *)(pCVar4->scan).current_row_index;
          if (pCVar11 < pCVar10 || (ColumnDataScanState *)(pCVar4->scan).next_row_index <= pCVar11)
          {
            duckdb::ColumnDataCollection::Seek
                      ((ulong)pCVar4->inputs,pCVar11,(DataChunk *)&pCVar4->scan);
            pvVar9 = vector<duckdb::Vector,_true>::operator[]
                               ((vector<duckdb::Vector,_true> *)&pCVar4->page,0);
            pCVar4->data = *(interval_t **)(pvVar9 + 0x20);
            pvVar9 = vector<duckdb::Vector,_true>::operator[]
                               ((vector<duckdb::Vector,_true> *)&pCVar4->page,0);
            FlatVector::VerifyFlatVector(pvVar9);
            pvVar9 = pvVar9 + 0x28;
            pCVar4->validity = (ValidityMask *)pvVar9;
            pCVar10 = (ColumnDataScanState *)(pCVar4->scan).current_row_index;
          }
          else {
            pvVar9 = (reference)pCVar4->validity;
          }
          if ((*(long *)pvVar9 == 0) ||
             ((*(ulong *)(*(long *)pvVar9 +
                         ((ulong)((long)pCVar11 - (long)pCVar10) >> 6 & 0x3ffffff) * 8) >>
               ((long)pCVar11 - (long)pCVar10 & 0x3fU) & 1) != 0)) {
            pCVar10 = (ColumnDataScanState *)(data->scan).current_row_index;
            if ((ColumnDataScanState *)(data->scan).next_row_index <= pCVar11 || pCVar11 < pCVar10)
            {
              duckdb::ColumnDataCollection::Seek
                        ((ulong)data->inputs,pCVar11,(DataChunk *)&data->scan);
              pvVar9 = vector<duckdb::Vector,_true>::operator[]
                                 ((vector<duckdb::Vector,_true> *)&data->page,0);
              data->data = *(interval_t **)(pvVar9 + 0x20);
              pvVar9 = vector<duckdb::Vector,_true>::operator[]
                                 ((vector<duckdb::Vector,_true> *)&data->page,0);
              FlatVector::VerifyFlatVector(pvVar9);
              data->validity = (ValidityMask *)(pvVar9 + 0x28);
              pCVar10 = (ColumnDataScanState *)(data->scan).current_row_index;
            }
            local_48.data = *(CursorType **)(data->data + (uint)((int)pCVar11 - (int)pCVar10));
            local_48.included =
                 (IncludedType *)data->data[(uint)((int)pCVar11 - (int)pCVar10)].micros;
            local_48.skip = (SkipListType *)pCVar11;
            duckdb_skiplistlib::skip_list::
            HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
            ::insert(this_01,(pair<unsigned_long,_duckdb::interval_t> *)&local_48);
          }
        }
      }
      pFVar12 = pFVar12 + 1;
    } while (pFVar12 != pFVar2);
  }
  return;
}

Assistant:

void UpdateSkip(CursorType &data, const SubFrames &frames, IncludedType &included) {
		//	No overlap, or no data
		if (!s || prevs.back().end <= frames.front().start || frames.back().end <= prevs.front().start) {
			auto &skip = GetSkipList(true);
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					if (included(i)) {
						skip.insert(SkipType(i, data[i]));
					}
				}
			}
		} else {
			auto &skip = GetSkipList();
			SkipListUpdater updater(skip, data, included);
			AggregateExecutor::IntersectFrames(prevs, frames, updater);
		}
	}